

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_debug(lua_State *L)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  size_t size;
  char local_118 [8];
  char buffer [250];
  lua_State *L_local;
  
  while( true ) {
    fprintf(_stderr,"%s","lua_debug> ");
    fflush(_stderr);
    pcVar2 = fgets(local_118,0xfa,_stdin);
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(local_118,"cont\n");
    if (iVar1 == 0) break;
    size = strlen(local_118);
    iVar1 = luaL_loadbufferx(L,local_118,size,"=(debug command)",(char *)0x0);
    if ((iVar1 != 0) || (iVar1 = lua_pcallk(L,0,0,0,0,(lua_KFunction)0x0), iVar1 != 0)) {
      __stream = _stderr;
      pcVar2 = luaL_tolstring(L,-1,(size_t *)0x0);
      fprintf(__stream,"%s\n",pcVar2);
      fflush(_stderr);
    }
    lua_settop(L,0);
  }
  return 0;
}

Assistant:

static int db_debug (lua_State *L) {
  for (;;) {
    char buffer[250];
    lua_writestringerror("%s", "lua_debug> ");
    if (fgets(buffer, sizeof(buffer), stdin) == NULL ||
        strcmp(buffer, "cont\n") == 0)
      return 0;
    if (luaL_loadbuffer(L, buffer, strlen(buffer), "=(debug command)") ||
        lua_pcall(L, 0, 0, 0))
      lua_writestringerror("%s\n", luaL_tolstring(L, -1, NULL));
    lua_settop(L, 0);  /* remove eventual returns */
  }
}